

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_storage.cpp
# Opt level: O2

void __thiscall duckdb::InMemoryLogStorage::ResetBuffers(InMemoryLogStorage *this)

{
  pointer pDVar1;
  pointer pCVar2;
  
  pDVar1 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                     (&this->entry_buffer);
  DataChunk::Reset(pDVar1);
  pDVar1 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                     (&this->log_context_buffer);
  DataChunk::Reset(pDVar1);
  pCVar2 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
           ::operator->(&this->log_entries);
  ColumnDataCollection::Reset(pCVar2);
  pCVar2 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
           ::operator->(&this->log_contexts);
  ColumnDataCollection::Reset(pCVar2);
  ::std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::clear(&(this->registered_contexts)._M_h);
  return;
}

Assistant:

void InMemoryLogStorage::ResetBuffers() {
	entry_buffer->Reset();
	log_context_buffer->Reset();

	log_entries->Reset();
	log_contexts->Reset();

	registered_contexts.clear();
}